

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

void __thiscall QAccessibleMenuBar::QAccessibleMenuBar(QAccessibleMenuBar *this,QWidget *w)

{
  long lVar1;
  undefined8 in_RSI;
  Role role;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_00;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  
  role = (Role)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w_00 = in_RDI;
  QString::QString((QString *)0x7db0f2);
  QAccessibleWidget::QAccessibleWidget(in_stack_ffffffffffffffe0,w_00,role,(QString *)in_RDI);
  QString::~QString((QString *)0x7db114);
  *(undefined ***)in_RDI = &PTR__QAccessibleMenuBar_00d27c40;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QAccessibleMenuBar_00d27d10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleMenuBar::QAccessibleMenuBar(QWidget *w)
    : QAccessibleWidget(w, QAccessible::MenuBar)
{
    Q_ASSERT(menuBar());
}